

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::LowerNewConcatStrMulti(Lowerer *this,Instr *instr)

{
  long lVar1;
  ScriptContextInfo *pSVar2;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  int iVar6;
  uint32 value;
  IntConstOpnd *this_00;
  undefined4 *puVar7;
  RegOpnd *newObjDst;
  size_t sVar8;
  undefined4 extraout_var;
  AddrOpnd *pAVar9;
  IndirOpnd *pIVar10;
  undefined4 extraout_var_00;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  this_00 = (IntConstOpnd *)IR::Instr::UnlinkSrc1(instr);
  OVar4 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar4 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar5) goto LAB_005be632;
    *puVar7 = 0;
  }
  newObjDst = (RegOpnd *)IR::Instr::UnlinkDst(instr);
  OVar4 = IR::Opnd::GetKind((Opnd *)newObjDst);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_005be632;
    *puVar7 = 0;
  }
  lVar1 = (this_00->super_EncodableOpnd<long>).m_value;
  local_32 = (newObjDst->super_Opnd).m_valueType.field_0;
  bVar5 = ValueType::IsString((ValueType *)&local_32.field_0);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x65c2,"(dstOpnd->GetValueType().IsString())",
                       "dstOpnd->GetValueType().IsString()");
    if (!bVar5) {
LAB_005be632:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  sVar8 = Js::ConcatStringMulti::GetAllocSize((uint)lVar1 & 0xff);
  GenerateRecyclerAllocAligned
            (this,HelperAllocMemForConcatStringMulti,sVar8 + 0xf & 0xfffffffffffffff0,newObjDst,
             instr,false);
  pSVar2 = instr->m_func->m_scriptContextInfo;
  iVar6 = (*pSVar2->_vptr_ScriptContextInfo[0x21])(pSVar2,0x33);
  pAVar9 = IR::AddrOpnd::New((Var)CONCAT44(extraout_var,iVar6),AddrOpndKindDynamicVtable,
                             this->m_func,false,(Var)0x0);
  pIVar10 = IR::IndirOpnd::New(newObjDst,0,(pAVar9->super_Opnd).m_type,this->m_func,false);
  InsertMove(&pIVar10->super_Opnd,&pAVar9->super_Opnd,instr,true);
  iVar6 = (*instr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[8])();
  pAVar9 = IR::AddrOpnd::New(CONCAT44(extraout_var_00,iVar6),AddrOpndKindDynamicType,instr->m_func,
                             true,(Var)0x0);
  pIVar10 = IR::IndirOpnd::New(newObjDst,8,(pAVar9->super_Opnd).m_type,this->m_func,false);
  InsertMove(&pIVar10->super_Opnd,&pAVar9->super_Opnd,instr,true);
  value = IR::IntConstOpnd::AsUint32(this_00);
  GenerateMemInit(this,newObjDst,0x1c,value,instr,true);
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void
Lowerer::LowerNewConcatStrMulti(IR::Instr * instr)
{
    IR::IntConstOpnd * countOpnd = instr->UnlinkSrc1()->AsIntConstOpnd();
    IR::RegOpnd * dstOpnd = instr->UnlinkDst()->AsRegOpnd();
    uint8 count = (uint8)countOpnd->GetValue();

    Assert(dstOpnd->GetValueType().IsString());

    GenerateRecyclerAlloc(IR::HelperAllocMemForConcatStringMulti, Js::ConcatStringMulti::GetAllocSize(count), dstOpnd, instr);

    GenerateRecyclerMemInit(dstOpnd, 0, this->LoadVTableValueOpnd(instr, VTableValue::VtableConcatStringMulti), instr);
    GenerateRecyclerMemInit(dstOpnd, Js::ConcatStringMulti::GetOffsetOfType(),
        this->LoadLibraryValueOpnd(instr, LibraryValue::ValueStringTypeStatic), instr);
    GenerateRecyclerMemInitNull(dstOpnd, Js::ConcatStringMulti::GetOffsetOfpszValue(), instr);
    GenerateRecyclerMemInit(dstOpnd, Js::ConcatStringMulti::GetOffsetOfcharLength(), 0, instr);
    GenerateRecyclerMemInit(dstOpnd, Js::ConcatStringMulti::GetOffsetOfSlotCount(), countOpnd->AsUint32(), instr);

    instr->Remove();
}